

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

void deqp::gls::BufferTestUtil::fillWithRandomBytes(deUint8 *ptr,int numBytes,deUint32 seed)

{
  RandomValueIterator<unsigned_char> RStack_48;
  RandomValueIterator<unsigned_char> local_30;
  
  tcu::RandomValueIterator<unsigned_char>::RandomValueIterator(&local_30,seed,numBytes);
  tcu::RandomValueIterator<unsigned_char>::end();
  std::copy<tcu::RandomValueIterator<unsigned_char>,unsigned_char*>(&local_30,&RStack_48,ptr);
  return;
}

Assistant:

void fillWithRandomBytes (deUint8* ptr, int numBytes, deUint32 seed)
{
	std::copy(tcu::RandomValueIterator<deUint8>::begin(seed, numBytes), tcu::RandomValueIterator<deUint8>::end(), ptr);
}